

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O2

STRING_HANDLE Azure_Base64_Encode_Bytes(uchar *source,size_t size)

{
  STRING_HANDLE pSVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  
  if (source == (uchar *)0x0) {
    return (STRING_HANDLE)0x0;
  }
  if (size == 0) {
    pSVar1 = (STRING_HANDLE)malloc(8);
    if (pSVar1 != (STRING_HANDLE)0x0) {
      pcVar2 = (char *)malloc(1);
      pSVar1->s = pcVar2;
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
        return pSVar1;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                  ,"STRING_new",0x25,1,"Failure allocating in STRING_new.");
      }
      free(pSVar1);
    }
    return (STRING_HANDLE)0x0;
  }
  pSVar1 = Base64_Encode_Internal(source,size);
  return pSVar1;
}

Assistant:

STRING_HANDLE Azure_Base64_Encode_Bytes(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    /*Codes_SRS_BASE64_02_001: [If source is NULL then Azure_Base64_Encode_Bytes shall return NULL.] */
    if (source == NULL)
    {
        result = NULL;
    }
    /*Codes_SRS_BASE64_02_002: [If source is not NULL and size is zero, then Azure_Base64_Encode_Bytes shall produce an empty STRING_HANDLE.] */
    else if (size == 0)
    {
        result = STRING_new(); /*empty string*/
    }
    else
    {
        result = Base64_Encode_Internal(source, size);
    }
    return result;
}